

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this,
               VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS)

{
  VkSampleCountFlagBits VVar1;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  IVec4 pixel;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> distinctValues;
  undefined1 local_78 [40];
  Vector<int,_4> *pVStack_50;
  long local_48;
  VkSampleCountFlagBits local_3c;
  TestStatus *local_38;
  
  VVar1 = (this->super_MSInstanceBaseResolve).super_MultisampleInstanceBase.m_imageMSParams.
          numSamples;
  local_78._32_8_ = (void *)0x0;
  pVStack_50 = (Vector<int,_4> *)0x0;
  local_48 = 0;
  uVar3 = (imageRSInfo->extent).depth;
  uVar7 = 0;
  if (uVar3 != 0) {
    uVar5 = (imageRSInfo->extent).height;
    uVar4 = uVar5;
    local_3c = VVar1;
    local_38 = __return_storage_ptr__;
    do {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar3 = (imageRSInfo->extent).width;
        uVar4 = 0;
        do {
          bVar8 = uVar3 != 0;
          uVar3 = 0;
          if (bVar8) {
            uVar5 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_78,(int)dataRS,uVar5,uVar4);
              _Var2 = std::
                      __find_if<__gnu_cxx::__normal_iterator<tcu::Vector<int,4>*,std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>>,__gnu_cxx::__ops::_Iter_equals_val<tcu::Vector<int,4>const>>
                                (local_78._32_8_,pVStack_50,local_78);
              if (_Var2._M_current == pVStack_50) {
                std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           (local_78 + 0x20),(value_type *)local_78);
              }
              uVar5 = uVar5 + 1;
              uVar3 = (imageRSInfo->extent).width;
            } while (uVar5 < uVar3);
            uVar5 = (imageRSInfo->extent).height;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar5);
        uVar3 = (imageRSInfo->extent).depth;
        uVar4 = uVar5;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 < uVar3);
    uVar7 = (long)pVStack_50 - local_78._32_8_ >> 4;
    __return_storage_ptr__ = local_38;
    VVar1 = local_3c;
  }
  if (uVar7 < VVar1 + VK_SAMPLE_COUNT_1_BIT) {
    local_78._0_8_ = (long)local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Expected numSamples+1 different colors in the output image","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_78._0_8_,
               (undefined1 *)(local_78._8_8_ + local_78._0_8_));
  }
  else {
    local_78._0_8_ = (long)local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Passed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_78._0_8_,
               (undefined1 *)(local_78._8_8_ + local_78._0_8_));
  }
  if (local_78._0_8_ != (long)local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if ((void *)local_78._32_8_ != (void *)0x0) {
    operator_delete((void *)local_78._32_8_,local_48 - local_78._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceDistinctValues>::verifyImageData (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS) const
{
	const deUint32 distinctValuesExpected = static_cast<deUint32>(m_imageMSParams.numSamples) + 1u;

	std::vector<tcu::IVec4> distinctValues;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;	 ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;	 ++x)
	{
		const tcu::IVec4 pixel = dataRS.getPixelInt(x, y, z);

		if (std::find(distinctValues.begin(), distinctValues.end(), pixel) == distinctValues.end())
			distinctValues.push_back(pixel);
	}

	if (distinctValues.size() >= distinctValuesExpected)
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Expected numSamples+1 different colors in the output image");
}